

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::WriteModelItem(MemoryWriter *wrt,LinTerms *lt,ItemNamer *vnam)

{
  BasicWriter<char> *this;
  size_t sVar1;
  size_t sVar2;
  int i;
  long lVar3;
  char *pcVar4;
  double dVar5;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  lVar3 = 0;
  do {
    if ((int)(lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size <= lVar3) {
      return;
    }
    dVar5 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[lVar3];
    if (lVar3 == 0) {
      if (dVar5 < 0.0) {
        pcVar4 = "-";
        sVar2 = 1;
        goto LAB_00288a23;
      }
    }
    else {
      pcVar4 = " - ";
      sVar2 = 3;
      if (0.0 <= dVar5) {
        pcVar4 = " + ";
      }
LAB_00288a23:
      value.size_ = sVar2;
      value.data_ = pcVar4;
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    }
    dVar5 = ABS(dVar5);
    if ((dVar5 != 1.0) || (NAN(dVar5))) {
      this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,dVar5);
      fmt::BasicWriter<char>::operator<<(this,'*');
    }
    pcVar4 = ItemNamer::at(vnam,(long)(lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.
                                      m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                      m_data_ptr[lVar3]);
    sVar1 = strlen(pcVar4);
    value_00.size_ = sVar1;
    value_00.data_ = pcVar4;
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const LinTerms& lt,
                    ItemNamer& vnam) {
  for (int i=0; i<(int)lt.size(); ++i) {
    auto coef = lt.coef(i);
    bool ifpos = coef>=0.0;
    if (i) {
      wrt << (ifpos ? " + " : " - ");
    } else {
      if (!ifpos)
        wrt << "-";
    }
    auto abscoef = std::fabs(coef);
    if (1.0 != abscoef)
      wrt << abscoef << '*';
    wrt << vnam.at(lt.var(i));
  }
}